

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_addsubq(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGv_i32 pTVar1;
  TCGv_i32 ea_result;
  int opsize;
  TCGv_i32 addr;
  TCGv_i32 pTStack_40;
  int imm;
  TCGv_i32 val;
  TCGv_i32 dest;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *pDStack_18;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  src = (TCGv_i32)s->uc->tcg_ctx;
  tcg_ctx._6_2_ = insn;
  pDStack_18 = s;
  s_local = (DisasContext_conflict2 *)env;
  if ((insn & 0x38) == 8) {
    ea_result._4_4_ = 2;
  }
  else {
    ea_result._4_4_ = insn_opsize((uint)insn);
  }
  dest = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,ea_result._4_4_,
                *(TCGv_i32 *)(src + 0x94f8),(TCGv_i32 *)&stack0xffffffffffffffb0,EA_LOADS,
                (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (dest == *(TCGv_i32 *)(src + 0x94f8)) {
    gen_addr_fault(pDStack_18);
  }
  else {
    addr._4_4_ = (int)(uint)tcg_ctx._6_2_ >> 9 & 7;
    if (addr._4_4_ == 0) {
      addr._4_4_ = 8;
    }
    pTStack_40 = tcg_const_i32_m68k((TCGContext_conflict2 *)src,addr._4_4_);
    val = tcg_temp_new_i32((TCGContext_conflict2 *)src);
    tcg_gen_mov_i32((TCGContext_conflict2 *)src,val,dest);
    if ((tcg_ctx._6_2_ & 0x38) == 8) {
      if ((tcg_ctx._6_2_ & 0x100) == 0) {
        tcg_gen_add_i32((TCGContext_conflict2 *)src,val,val,pTStack_40);
      }
      else {
        tcg_gen_sub_i32((TCGContext_conflict2 *)src,val,val,pTStack_40);
      }
    }
    else {
      if ((tcg_ctx._6_2_ & 0x100) == 0) {
        tcg_gen_add_i32((TCGContext_conflict2 *)src,val,val,pTStack_40);
        tcg_gen_setcond_i32_m68k((TCGContext_conflict2 *)src,TCG_COND_LTU,QREG_CC_X,val,pTStack_40);
        set_cc_op(pDStack_18,ea_result._4_4_ + CC_OP_ADDB);
      }
      else {
        tcg_gen_setcond_i32_m68k((TCGContext_conflict2 *)src,TCG_COND_LTU,QREG_CC_X,val,pTStack_40);
        tcg_gen_sub_i32((TCGContext_conflict2 *)src,val,val,pTStack_40);
        set_cc_op(pDStack_18,ea_result._4_4_ + CC_OP_SUBB);
      }
      gen_update_cc_add((TCGContext_conflict2 *)src,val,pTStack_40,ea_result._4_4_);
    }
    tcg_temp_free_i32((TCGContext_conflict2 *)src,pTStack_40);
    pTVar1 = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,ea_result._4_4_,val,
                    (TCGv_i32 *)&stack0xffffffffffffffb0,EA_STORE,
                    (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar1 == *(TCGv_i32 *)(src + 0x94f8)) {
      gen_addr_fault(pDStack_18);
    }
    else {
      tcg_temp_free_i32((TCGContext_conflict2 *)src,val);
    }
  }
  return;
}

Assistant:

DISAS_INSN(addsubq)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv dest;
    TCGv val;
    int imm;
    TCGv addr;
    int opsize;

    if ((insn & 070) == 010) {
        /* Operation on address register is always long.  */
        opsize = OS_LONG;
    } else {
        opsize = insn_opsize(insn);
    }
    SRC_EA(env, src, opsize, 1, &addr);
    imm = (insn >> 9) & 7;
    if (imm == 0) {
        imm = 8;
    }
    val = tcg_const_i32(tcg_ctx, imm);
    dest = tcg_temp_new(tcg_ctx);
    tcg_gen_mov_i32(tcg_ctx, dest, src);
    if ((insn & 0x38) == 0x08) {
        /*
         * Don't update condition codes if the destination is an
         * address register.
         */
        if (insn & 0x0100) {
            tcg_gen_sub_i32(tcg_ctx, dest, dest, val);
        } else {
            tcg_gen_add_i32(tcg_ctx, dest, dest, val);
        }
    } else {
        if (insn & 0x0100) {
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, dest, val);
            tcg_gen_sub_i32(tcg_ctx, dest, dest, val);
            set_cc_op(s, CC_OP_SUBB + opsize);
        } else {
            tcg_gen_add_i32(tcg_ctx, dest, dest, val);
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, dest, val);
            set_cc_op(s, CC_OP_ADDB + opsize);
        }
        gen_update_cc_add(tcg_ctx, dest, val, opsize);
    }
    tcg_temp_free(tcg_ctx, val);
    DEST_EA(env, insn, opsize, dest, &addr);
    tcg_temp_free(tcg_ctx, dest);
}